

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::executeTestRun
          (TessellationShaderTCTEDataPassThrough *this,_run *run,
          _tessellation_primitive_mode primitive_mode,bool should_use_geometry_shader,
          bool should_pass_point_size_data_in_gs,bool should_pass_point_size_data_in_ts)

{
  long lVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  float fVar4;
  int iVar5;
  GLuint GVar6;
  deUint32 dVar7;
  uint uVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  ulong uVar11;
  TestError *this_00;
  undefined7 in_register_00000009;
  _tessellation_primitive_mode primitive_mode_00;
  float *position_data;
  char *pcVar12;
  string *psVar13;
  uint n_shader;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  char local_2f8;
  int local_2f4;
  char *gs_point_size_varyings [6];
  char *non_gs_non_point_size_varyings [5];
  value_type local_278;
  char *gs_non_point_size_varyings [4];
  long local_240;
  long local_238;
  ulong local_230;
  float tess_levels [4];
  char *body_raw_ptr_1;
  GLuint GStack_210;
  GLuint GStack_20c;
  GLuint local_208;
  vector<float,_std::allocator<float>_> *local_1f8;
  vector<float,_std::allocator<float>_> *local_1f0;
  vector<glcts::_vec4,_std::allocator<glcts::_vec4>_> *local_1e8;
  vector<glcts::_vec4,_std::allocator<glcts::_vec4>_> *local_1e0;
  vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_> *local_1d8;
  GLint link_status;
  char *fs_body;
  char *vs_body;
  char *non_gs_point_size_varyings [7];
  long lVar10;
  
  run->primitive_mode = primitive_mode;
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  GVar6 = (**(code **)(lVar10 + 0x3c8))();
  run->po_id = GVar6;
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x132);
  GVar6 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
  run->fs_id = GVar6;
  GVar6 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  run->tcs_id = GVar6;
  GVar6 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  run->tes_id = GVar6;
  GVar6 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  run->vs_id = GVar6;
  if ((int)CONCAT71(in_register_00000009,should_use_geometry_shader) != 0) {
    GVar6 = (**(code **)(lVar10 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    run->gs_id = GVar6;
  }
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x13f);
  (**(code **)(lVar10 + 0x10))(run->po_id,run->fs_id);
  (**(code **)(lVar10 + 0x10))(run->po_id,run->tcs_id);
  (**(code **)(lVar10 + 0x10))(run->po_id,run->tes_id);
  (**(code **)(lVar10 + 0x10))(run->po_id,run->vs_id);
  if (should_use_geometry_shader) {
    (**(code **)(lVar10 + 0x10))(run->po_id,run->gs_id);
  }
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glAttachShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x14c);
  vs_body = 
  "${VERSION}\n\n${SHADER_IO_BLOCKS_REQUIRE}\n\nout OUT_VS\n{\n    vec4  value1;\n    ivec4 value2;\n} out_data;\n\nvoid main()\n{\n    gl_Position     = vec4( float(gl_VertexID) );\n    gl_PointSize    = 1.0 / float(gl_VertexID + 1);\n    out_data.value1 =  vec4(float(gl_VertexID),        float(gl_VertexID) * 0.5,\n                            float(gl_VertexID) * 0.25, float(gl_VertexID) * 0.125);\n    out_data.value2 = ivec4(gl_VertexID,               gl_VertexID + 1,\n                            gl_VertexID + 2,           gl_VertexID + 3);\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->vs_id,1,&vs_body);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() call failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x164);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->fs_id,1,&fs_body);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() call failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x16e);
  std::__cxx11::stringstream::stringstream((stringstream *)non_gs_point_size_varyings);
  gs_point_size_varyings[0] = (char *)(gs_point_size_varyings + 2);
  gs_point_size_varyings[1] = (char *)0x0;
  gs_point_size_varyings[2] = (char *)((ulong)gs_point_size_varyings[2] & 0xffffffffffffff00);
  gs_non_point_size_varyings[0] = (char *)0x0;
  poVar3 = (ostream *)(non_gs_point_size_varyings + 2);
  std::operator<<(poVar3,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(poVar3,
                  "\nlayout(vertices = 2) out;\n\nin OUT_VS\n{\n    vec4  value1;\n    ivec4 value2;\n} in_vs_data[];\n\nout OUT_TC\n{\n"
                 );
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,"    float tc_pointSize;\n");
  }
  std::operator<<(poVar3,
                  "     vec4  tc_position;\n     vec4  tc_value1;\n    ivec4  tc_value2;\n} out_data[];\n\npatch out vec4 tc_patch_data;\n\nvoid main()\n{\n    int multiplier = 1;\n\n    if (gl_InvocationID == 0)\n    {\n        multiplier = 2;\n    }\n"
                 );
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,
                    "    out_data         [gl_InvocationID].tc_pointSize = gl_in[0].gl_PointSize;\n    gl_out           [gl_InvocationID].gl_PointSize = gl_in[0].gl_PointSize * 2.0;\n"
                   );
  }
  std::operator<<(poVar3,
                  "    out_data         [gl_InvocationID].tc_position  = gl_in     [0].gl_Position;\n    out_data         [gl_InvocationID].tc_value1    = in_vs_data[0].value1      *  vec4(float(multiplier) );\n    out_data         [gl_InvocationID].tc_value2    = in_vs_data[0].value2      * ivec4(      multiplier);\n    gl_out           [gl_InvocationID].gl_Position  = gl_in     [0].gl_Position + vec4(3.0);\n    gl_TessLevelInner[0]                            = 4.0;\n    gl_TessLevelInner[1]                            = 4.0;\n    gl_TessLevelOuter[0]                            = 4.0;\n    gl_TessLevelOuter[1]                            = 4.0;\n    gl_TessLevelOuter[2]                            = 4.0;\n    gl_TessLevelOuter[3]                            = 4.0;\n\n    if (gl_InvocationID == 0)\n    {\n        tc_patch_data = in_vs_data[0].value1 *  vec4(float(multiplier) );\n    }\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)gs_point_size_varyings,(string *)non_gs_non_point_size_varyings);
  std::__cxx11::string::~string((string *)non_gs_non_point_size_varyings);
  gs_non_point_size_varyings[0] = gs_point_size_varyings[0];
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,run->tcs_id,1,gs_non_point_size_varyings);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() call failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x1bd);
  std::__cxx11::string::~string((string *)gs_point_size_varyings);
  std::__cxx11::stringstream::~stringstream((stringstream *)non_gs_point_size_varyings);
  std::__cxx11::stringstream::stringstream((stringstream *)non_gs_point_size_varyings);
  gs_point_size_varyings[0] = (char *)(gs_point_size_varyings + 2);
  gs_point_size_varyings[1] = (char *)0x0;
  gs_point_size_varyings[2] = (char *)((ulong)gs_point_size_varyings[2] & 0xffffffffffffff00);
  body_raw_ptr_1 = (char *)0x0;
  poVar3 = (ostream *)(non_gs_point_size_varyings + 2);
  std::operator<<(poVar3,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(poVar3,"\nlayout(PRIMITIVE_MODE, point_mode) in;\n\nin OUT_TC\n{\n");
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,"    float tc_pointSize;\n");
  }
  std::operator<<(poVar3,
                  "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n} in_data[];\n\npatch in vec4 tc_patch_data;\n\n"
                 );
  if (should_use_geometry_shader) {
    std::operator<<(poVar3,"out OUT_TE\n{\n");
    pcVar12 = 
    "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n    vec4  te_position;\n} out_data;\n"
    ;
    if (should_pass_point_size_data_in_ts) {
      std::operator<<(poVar3,"    float tc_pointSize;\n    float te_pointSize;\n");
    }
  }
  else {
    pcVar12 = 
    "out  vec4  tc_position;\nout  vec4  tc_value1;\nflat out ivec4  tc_value2;\nout  vec4  te_position;\nout  vec4  te_patch_data;\n"
    ;
    if (should_pass_point_size_data_in_ts) {
      std::operator<<(poVar3,"out float tc_pointSize;\nout float te_pointSize;\n");
    }
  }
  std::operator<<(poVar3,pcVar12);
  std::operator<<(poVar3,"\nvoid main()\n{\n");
  pcVar12 = "#define OUTPUT_VARIABLE(x) x\n";
  if (should_use_geometry_shader) {
    pcVar12 = "#define OUTPUT_VARIABLE(x) out_data.x\n";
  }
  std::operator<<(poVar3,pcVar12);
  if (should_pass_point_size_data_in_ts) {
    std::operator<<(poVar3,
                    "    OUTPUT_VARIABLE(tc_pointSize) = in_data[1].tc_pointSize;\n    OUTPUT_VARIABLE(te_pointSize) = gl_in[1].gl_PointSize;\n"
                   );
  }
  std::operator<<(poVar3,
                  "    OUTPUT_VARIABLE(tc_position)   = in_data[1].tc_position;\n    OUTPUT_VARIABLE(tc_value1)     = in_data[0].tc_value1;\n    OUTPUT_VARIABLE(tc_value2)     = in_data[1].tc_value2;\n    OUTPUT_VARIABLE(te_position)   = gl_in[0].gl_Position;\n"
                 );
  if (!should_use_geometry_shader) {
    std::operator<<(poVar3,"    OUTPUT_VARIABLE(te_patch_data) = tc_patch_data;\n");
  }
  std::operator<<(poVar3,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)gs_point_size_varyings,(string *)non_gs_non_point_size_varyings);
  std::__cxx11::string::~string((string *)non_gs_non_point_size_varyings);
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)non_gs_non_point_size_varyings,
             (TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)gs_non_point_size_varyings,"PRIMITIVE_MODE",(allocator<char> *)tess_levels);
  uVar11 = std::__cxx11::string::find
                     ((string *)gs_point_size_varyings,(ulong)gs_non_point_size_varyings);
  while (uVar11 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)gs_point_size_varyings,uVar11,(string *)gs_non_point_size_varyings[1]);
    std::__cxx11::string::_M_assign((string *)gs_point_size_varyings);
    uVar11 = std::__cxx11::string::find
                       ((string *)gs_point_size_varyings,(ulong)gs_non_point_size_varyings);
  }
  body_raw_ptr_1 = gs_point_size_varyings[0];
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->tes_id,1,&body_raw_ptr_1);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() call failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x23c);
  std::__cxx11::string::~string((string *)gs_non_point_size_varyings);
  std::__cxx11::string::~string((string *)non_gs_non_point_size_varyings);
  std::__cxx11::string::~string((string *)gs_point_size_varyings);
  std::__cxx11::stringstream::~stringstream((stringstream *)non_gs_point_size_varyings);
  if (should_use_geometry_shader) {
    std::__cxx11::stringstream::stringstream((stringstream *)non_gs_point_size_varyings);
    gs_point_size_varyings[0] = (char *)(gs_point_size_varyings + 2);
    gs_point_size_varyings[1] = (char *)0x0;
    gs_point_size_varyings[2] = (char *)((ulong)gs_point_size_varyings[2] & 0xffffffffffffff00);
    poVar3 = (ostream *)(non_gs_point_size_varyings + 2);
    std::operator<<(poVar3,"${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n");
    if (should_pass_point_size_data_in_gs) {
      std::operator<<(poVar3,"${GEOMETRY_POINT_SIZE_REQUIRE}\n");
    }
    std::operator<<(poVar3,
                    "${SHADER_IO_BLOCKS_REQUIRE}\n\nlayout(points)                   in;\nlayout(max_vertices = 2, points) out;\n\nin OUT_TE\n{\n"
                   );
    if (should_pass_point_size_data_in_ts) {
      std::operator<<(poVar3,"    float tc_pointSize;\n    float te_pointSize;\n");
    }
    std::operator<<(poVar3,
                    "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n    vec4  te_position;\n} in_data[1];\n\nout float gs_tc_pointSize;\nout float gs_te_pointSize;\nout  vec4 gs_tc_position;\nout  vec4 gs_tc_value1;\nflat out ivec4 gs_tc_value2;\nout  vec4 gs_te_position;\n\nvoid main()\n{\n"
                   );
    if (should_pass_point_size_data_in_gs) {
      std::operator<<(poVar3,
                      "    gs_tc_pointSize = in_data[0].tc_pointSize;\n    gs_te_pointSize = in_data[0].te_pointSize;\n"
                     );
    }
    std::operator<<(poVar3,
                    "    gs_tc_position = in_data[0].tc_position;\n    gs_tc_value1   = in_data[0].tc_value1;\n    gs_tc_value2   = in_data[0].tc_value2;\n    gs_te_position = in_data[0].te_position;\n    EmitVertex();\n"
                   );
    if (should_pass_point_size_data_in_gs) {
      std::operator<<(poVar3,
                      "    gs_tc_pointSize = in_data[0].tc_pointSize + 1.0;\n    gs_te_pointSize = in_data[0].te_pointSize + 1.0;\n"
                     );
    }
    std::operator<<(poVar3,
                    "    gs_tc_position = in_data[0].tc_position +  vec4(1.0);\n    gs_tc_value1   = in_data[0].tc_value1   +  vec4(1.0);\n    gs_tc_value2   = in_data[0].tc_value2   + ivec4(1);\n    gs_te_position = in_data[0].te_position +  vec4(1.0);\n\n    EmitVertex();\n\n}\n"
                   );
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)gs_point_size_varyings,(string *)non_gs_non_point_size_varyings);
    std::__cxx11::string::~string((string *)non_gs_non_point_size_varyings);
    gs_non_point_size_varyings[0] = gs_point_size_varyings[0];
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,run->gs_id,1,(GLchar **)gs_non_point_size_varyings);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glShaderSource() call failed for geometry shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x28c);
    std::__cxx11::string::~string((string *)gs_point_size_varyings);
    std::__cxx11::stringstream::~stringstream((stringstream *)non_gs_point_size_varyings);
    psVar13 = (string *)gs_non_point_size_varyings;
    if (should_pass_point_size_data_in_gs) {
      psVar13 = (string *)gs_point_size_varyings;
    }
    local_2f4 = (uint)should_pass_point_size_data_in_gs * 8 + 0x40;
    local_238 = 0x44;
    if (!should_pass_point_size_data_in_gs) {
      local_238 = 0xffffffff;
    }
    local_240 = 0x40;
    local_230 = 0xffffffff;
    if (!should_pass_point_size_data_in_gs) {
      local_240 = 0xffffffff;
    }
    iVar5 = (uint)should_pass_point_size_data_in_gs * 2 + 4;
    local_2f8 = should_pass_point_size_data_in_gs;
  }
  else {
    local_230 = (ulong)((uint)should_pass_point_size_data_in_ts * 8) | 0x40;
    psVar13 = (string *)non_gs_non_point_size_varyings;
    if (should_pass_point_size_data_in_ts) {
      psVar13 = (string *)non_gs_point_size_varyings;
    }
    local_2f4 = (uint)should_pass_point_size_data_in_ts * 8 + 0x50;
    local_238 = 0x44;
    if (!should_pass_point_size_data_in_ts) {
      local_238 = 0xffffffff;
    }
    local_240 = 0x40;
    if (!should_pass_point_size_data_in_ts) {
      local_240 = 0xffffffff;
    }
    iVar5 = (uint)should_pass_point_size_data_in_ts * 2 + 5;
    local_2f8 = should_pass_point_size_data_in_ts;
  }
  non_gs_point_size_varyings[6] = "te_patch_data";
  non_gs_point_size_varyings[5] = "te_pointSize";
  non_gs_point_size_varyings[4] = "tc_pointSize";
  non_gs_point_size_varyings[3] = "te_position";
  non_gs_point_size_varyings[2] = "tc_value2";
  non_gs_point_size_varyings[1]._4_4_ = 0;
  non_gs_point_size_varyings[1]._0_4_ = 0x17b9fda;
  non_gs_point_size_varyings[0]._4_4_ = 0;
  non_gs_point_size_varyings[0]._0_4_ = 0x1894d72;
  gs_non_point_size_varyings[3] = "gs_te_position";
  gs_non_point_size_varyings[2] = "gs_tc_value2";
  gs_non_point_size_varyings[1] = "gs_tc_value1";
  gs_non_point_size_varyings[0] = "gs_tc_position";
  non_gs_non_point_size_varyings[4] = "te_patch_data";
  non_gs_non_point_size_varyings[3] = "te_position";
  non_gs_non_point_size_varyings[2] = "tc_value2";
  non_gs_non_point_size_varyings[1] = "tc_value1";
  non_gs_non_point_size_varyings[0] = "tc_position";
  gs_point_size_varyings[5] = "gs_te_pointSize";
  gs_point_size_varyings[4] = "gs_tc_pointSize";
  gs_point_size_varyings[3] = "gs_te_position";
  gs_point_size_varyings[2] = "gs_tc_value2";
  gs_point_size_varyings[1] = "gs_tc_value1";
  gs_point_size_varyings[0] = "gs_tc_position";
  (**(code **)(lVar10 + 0x14c8))(run->po_id,iVar5,psVar13,0x8c8c);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glTransformFeedbackVaryings() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x2f4);
  body_raw_ptr_1 = *(char **)run;
  GStack_210 = run->tcs_id;
  GStack_20c = run->tes_id;
  local_208 = run->vs_id;
  for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
    fVar4 = *(float *)((long)&body_raw_ptr_1 + lVar14 * 4);
    tess_levels[0] = fVar4;
    if (fVar4 != 0.0) {
      TessellationShaderUtils::compileShaders(this->m_utils_ptr,1,(GLuint *)tess_levels,true);
    }
  }
  (**(code **)(lVar10 + 0xce8))(run->po_id);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glLinkProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x306);
  link_status = 0;
  (**(code **)(lVar10 + 0x9d8))(run->po_id,0x8b82,&link_status);
  dVar7 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar7,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x30c);
  if (link_status == 1) {
    tess_levels[0] = 4.0;
    tess_levels[1] = 4.0;
    tess_levels[2] = 4.0;
    tess_levels[3] = 4.0;
    uVar15 = 0;
    uVar8 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      (this->m_utils_ptr,run->primitive_mode,tess_levels,tess_levels,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,true);
    uVar8 = uVar8 << (should_use_geometry_shader & 0x1fU);
    run->n_result_vertices_per_patch = uVar8;
    uVar8 = uVar8 * this->m_n_input_vertices_per_run;
    uVar11 = (ulong)uVar8;
    iVar5 = uVar8 * local_2f4;
    (**(code **)(lVar10 + 0x150))(0x8c8e,iVar5,0,0x88e4);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glBufferData() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x32c);
    GVar9 = TessellationShaderUtils::getTFModeForPrimitiveMode(run->primitive_mode,true);
    (**(code **)(lVar10 + 0x1680))(run->po_id);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x333);
    (**(code **)(lVar10 + 0x30))(GVar9);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glBeginTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x336);
    (**(code **)(lVar10 + 0x538))
              ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,this->m_n_input_vertices_per_run);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x339);
    (**(code **)(lVar10 + 0x638))();
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x33c);
    lVar14 = (**(code **)(lVar10 + 0xd00))(0x8c8e,0,iVar5,1);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glMapBufferRange() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x343);
    local_1d8 = &run->result_tc_value2_data;
    local_1e0 = &run->result_te_position_data;
    local_1f0 = &run->result_tc_pointSize_data;
    local_1f8 = &run->result_te_pointSize_data;
    local_1e8 = &run->result_te_patch_data;
    while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
      lVar1 = lVar14 + uVar15;
      local_278._0_8_ = *(undefined8 *)(lVar14 + uVar15);
      local_278._8_8_ = ((undefined8 *)(lVar14 + uVar15))[1];
      std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
                (&run->result_tc_position_data,&local_278);
      puVar2 = (undefined8 *)(lVar14 + 0x10 + uVar15);
      local_278._0_8_ = *puVar2;
      local_278._8_8_ = puVar2[1];
      std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
                (&run->result_tc_value1_data,&local_278);
      puVar2 = (undefined8 *)(lVar14 + 0x20 + uVar15);
      local_278._0_8_ = *puVar2;
      local_278._8_8_ = puVar2[1];
      std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::push_back
                (local_1d8,(value_type *)&local_278);
      puVar2 = (undefined8 *)(lVar14 + 0x30 + uVar15);
      local_278._0_8_ = *puVar2;
      local_278._8_8_ = puVar2[1];
      std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back(local_1e0,&local_278);
      if (local_2f8 != '\0') {
        std::vector<float,_std::allocator<float>_>::push_back
                  (local_1f0,(value_type_conflict2 *)(lVar1 + local_240));
        std::vector<float,_std::allocator<float>_>::push_back
                  (local_1f8,(value_type_conflict2 *)(lVar1 + local_238));
      }
      if (!should_use_geometry_shader) {
        local_278._0_8_ = *(undefined8 *)(lVar1 + local_230);
        local_278._8_8_ = ((undefined8 *)(lVar1 + local_230))[1];
        std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back(local_1e8,&local_278);
      }
      uVar15 = (ulong)(uint)((int)uVar15 + local_2f4);
    }
    (**(code **)(lVar10 + 0x1670))(0x8c8e);
    dVar7 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar7,"glUnmapBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,899);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
             ,0x310);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEDataPassThrough::executeTestRun(_run& run, _tessellation_primitive_mode primitive_mode,
														   bool should_use_geometry_shader,
														   bool should_pass_point_size_data_in_gs,
														   bool should_pass_point_size_data_in_ts)
{
	run.primitive_mode = primitive_mode;

	/* Retrieve ES entry-points before we start */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object first */
	run.po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Create all shader objects we wil be later attaching to the program object */
	run.fs_id  = gl.createShader(GL_FRAGMENT_SHADER);
	run.tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	run.tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	run.vs_id  = gl.createShader(GL_VERTEX_SHADER);

	if (should_use_geometry_shader)
	{
		run.gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Attach the shader objects to the program object */
	gl.attachShader(run.po_id, run.fs_id);
	gl.attachShader(run.po_id, run.tcs_id);
	gl.attachShader(run.po_id, run.tes_id);
	gl.attachShader(run.po_id, run.vs_id);

	if (should_use_geometry_shader)
	{
		gl.attachShader(run.po_id, run.gs_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

	/* Set vertex shader's body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "${SHADER_IO_BLOCKS_REQUIRE}\n"
						  "\n"
						  "out OUT_VS\n"
						  "{\n"
						  "    vec4  value1;\n"
						  "    ivec4 value2;\n"
						  "} out_data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position     = vec4( float(gl_VertexID) );\n"
						  "    gl_PointSize    = 1.0 / float(gl_VertexID + 1);\n"
						  "    out_data.value1 =  vec4(float(gl_VertexID),        float(gl_VertexID) * 0.5,\n"
						  "                            float(gl_VertexID) * 0.25, float(gl_VertexID) * 0.125);\n"
						  "    out_data.value2 = ivec4(gl_VertexID,               gl_VertexID + 1,\n"
						  "                            gl_VertexID + 2,           gl_VertexID + 3);\n"
						  "}\n";

	shaderSourceSpecialized(run.vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for vertex shader");

	/* Set dummy fragment shader's body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(run.fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for fragment shader");

	/* Set tessellation control shader's body */
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		body_sstream << "${VERSION}\n"
						"\n"
						"${TESSELLATION_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
		}

		body_sstream << "\n"
						"layout(vertices = 2) out;\n"
						"\n"
						"in OUT_VS\n"
						"{\n"
						"    vec4  value1;\n"
						"    ivec4 value2;\n"
						"} in_vs_data[];\n"
						"\n"
						"out OUT_TC\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n";
		}

		body_sstream << "     vec4  tc_position;\n"
						"     vec4  tc_value1;\n"
						"    ivec4  tc_value2;\n"
						"} out_data[];\n"
						"\n"
						"patch out vec4 tc_patch_data;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    int multiplier = 1;\n"
						"\n"
						"    if (gl_InvocationID == 0)\n"
						"    {\n"
						"        multiplier = 2;\n"
						"    }\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    out_data         [gl_InvocationID].tc_pointSize = gl_in[0].gl_PointSize;\n"
							"    gl_out           [gl_InvocationID].gl_PointSize = gl_in[0].gl_PointSize * 2.0;\n";
		}

		body_sstream << "    out_data         [gl_InvocationID].tc_position  = gl_in     [0].gl_Position;\n"
						"    out_data         [gl_InvocationID].tc_value1    = in_vs_data[0].value1      *  "
						"vec4(float(multiplier) );\n"
						"    out_data         [gl_InvocationID].tc_value2    = in_vs_data[0].value2      * ivec4(      "
						"multiplier);\n"
						"    gl_out           [gl_InvocationID].gl_Position  = gl_in     [0].gl_Position + vec4(3.0);\n"
						"    gl_TessLevelInner[0]                            = 4.0;\n"
						"    gl_TessLevelInner[1]                            = 4.0;\n"
						"    gl_TessLevelOuter[0]                            = 4.0;\n"
						"    gl_TessLevelOuter[1]                            = 4.0;\n"
						"    gl_TessLevelOuter[2]                            = 4.0;\n"
						"    gl_TessLevelOuter[3]                            = 4.0;\n"
						"\n"
						"    if (gl_InvocationID == 0)\n"
						"    {\n"
						"        tc_patch_data = in_vs_data[0].value1 *  vec4(float(multiplier) );\n"
						"    }\n"
						"}\n";

		body_string  = body_sstream.str();
		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.tcs_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for tessellation control shader");
	}

	/* Set tessellation evaluation shader's body */
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		/* Preamble */
		body_sstream << "${VERSION}\n"
						"\n"
						"${TESSELLATION_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
		}

		/* Layout qualifiers */
		body_sstream << "\n"
						"layout(PRIMITIVE_MODE, point_mode) in;\n"
						"\n"

						/* Input block definition starts here: */
						"in OUT_TC\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n";
		}

		body_sstream << "    vec4  tc_position;\n"
						"    vec4  tc_value1;\n"
						"   ivec4  tc_value2;\n"
						"} in_data[];\n"
						"\n"
						"patch in vec4 tc_patch_data;\n"
						"\n";
		/* Input block definition ends here. */

		/* Output block definition (only defined if GS stage is present) starts here: */
		if (should_use_geometry_shader)
		{
			body_sstream << "out OUT_TE\n"
							"{\n";

			/* Output block contents */
			if (should_pass_point_size_data_in_ts)
			{
				body_sstream << "    float tc_pointSize;\n"
								"    float te_pointSize;\n";
			}

			body_sstream << "    vec4  tc_position;\n"
							"    vec4  tc_value1;\n"
							"   ivec4  tc_value2;\n"
							"    vec4  te_position;\n"
							"} out_data;\n";
		}
		/* Output block definition ends here. */
		else
		{
			if (should_pass_point_size_data_in_ts)
			{
				body_sstream << "out float tc_pointSize;\n"
								"out float te_pointSize;\n";
			}

			body_sstream << "out  vec4  tc_position;\n"
							"out  vec4  tc_value1;\n"
							"flat out ivec4  tc_value2;\n"
							"out  vec4  te_position;\n"
							"out  vec4  te_patch_data;\n";
		}

		body_sstream << "\n"
						"void main()\n"
						"{\n";

		if (should_use_geometry_shader)
		{
			body_sstream << "#define OUTPUT_VARIABLE(x) out_data.x\n";
		}
		else
		{
			body_sstream << "#define OUTPUT_VARIABLE(x) x\n";
		}

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    OUTPUT_VARIABLE(tc_pointSize) = in_data[1].tc_pointSize;\n"
							"    OUTPUT_VARIABLE(te_pointSize) = gl_in[1].gl_PointSize;\n";
		}

		body_sstream << "    OUTPUT_VARIABLE(tc_position)   = in_data[1].tc_position;\n"
						"    OUTPUT_VARIABLE(tc_value1)     = in_data[0].tc_value1;\n"
						"    OUTPUT_VARIABLE(tc_value2)     = in_data[1].tc_value2;\n"
						"    OUTPUT_VARIABLE(te_position)   = gl_in[0].gl_Position;\n";

		if (!should_use_geometry_shader)
		{
			body_sstream << "    OUTPUT_VARIABLE(te_patch_data) = tc_patch_data;\n";
		}
		body_sstream << "}\n";

		body_string = body_sstream.str();

		/* Replace PRIMITIVE_MODE token with user-requested primitive mode */
		std::string primitive_mode_replacement	= TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
		std::string primitive_mode_token		  = "PRIMITIVE_MODE";
		std::size_t primitive_mode_token_position = std::string::npos;

		primitive_mode_token_position = body_string.find(primitive_mode_token);

		while (primitive_mode_token_position != std::string::npos)
		{
			body_string = body_string.replace(primitive_mode_token_position, primitive_mode_token.length(),
											  primitive_mode_replacement);

			primitive_mode_token_position = body_string.find(primitive_mode_token);
		}

		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.tes_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for tessellation evaluation shader");
	}

	/* Set geometry shader's body (if requested) */
	if (should_use_geometry_shader)
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		body_sstream << "${VERSION}\n"
						"\n"
						"${GEOMETRY_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "${GEOMETRY_POINT_SIZE_REQUIRE}\n";
		}

		body_sstream << "${SHADER_IO_BLOCKS_REQUIRE}\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(max_vertices = 2, points) out;\n"
						"\n"
						"in OUT_TE\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n"
							"    float te_pointSize;\n";
		}

		body_sstream << "    vec4  tc_position;\n"
						"    vec4  tc_value1;\n"
						"   ivec4  tc_value2;\n"
						"    vec4  te_position;\n"
						"} in_data[1];\n"
						"\n"
						"out float gs_tc_pointSize;\n"
						"out float gs_te_pointSize;\n"
						"out  vec4 gs_tc_position;\n"
						"out  vec4 gs_tc_value1;\n"
						"flat out ivec4 gs_tc_value2;\n"
						"out  vec4 gs_te_position;\n"
						"\n"
						"void main()\n"
						"{\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "    gs_tc_pointSize = in_data[0].tc_pointSize;\n"
							"    gs_te_pointSize = in_data[0].te_pointSize;\n";
		}

		body_sstream << "    gs_tc_position = in_data[0].tc_position;\n"
						"    gs_tc_value1   = in_data[0].tc_value1;\n"
						"    gs_tc_value2   = in_data[0].tc_value2;\n"
						"    gs_te_position = in_data[0].te_position;\n"
						"    EmitVertex();\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "    gs_tc_pointSize = in_data[0].tc_pointSize + 1.0;\n"
							"    gs_te_pointSize = in_data[0].te_pointSize + 1.0;\n";
		}

		body_sstream << "    gs_tc_position = in_data[0].tc_position +  vec4(1.0);\n"
						"    gs_tc_value1   = in_data[0].tc_value1   +  vec4(1.0);\n"
						"    gs_tc_value2   = in_data[0].tc_value2   + ivec4(1);\n"
						"    gs_te_position = in_data[0].te_position +  vec4(1.0);\n"
						"\n"
						"    EmitVertex();\n"
						"\n"
						"}\n";

		body_string  = body_sstream.str();
		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.gs_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for geometry shader");
	}

	/* Configure varyings */
	unsigned int	   n_varyings					= 0;
	int				   varying_tc_pointSize_offset  = -1;
	int				   varying_tc_position_offset   = -1;
	int				   varying_tc_value1_offset		= -1;
	int				   varying_tc_value2_offset		= -1;
	int				   varying_te_patch_data_offset = -1;
	int				   varying_te_pointSize_offset  = -1;
	int				   varying_te_position_offset   = -1;
	const unsigned int varying_patch_data_size		= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_pointSize_size		= sizeof(float);
	const unsigned int varying_position_size		= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_value1_size			= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_value2_size			= sizeof(int) * 4;   /* ivec4 */
	const char**	   varyings						= DE_NULL;
	unsigned int	   varyings_size				= 0;

	const char* gs_non_point_size_varyings[] = { "gs_tc_position", "gs_tc_value1", "gs_tc_value2", "gs_te_position" };
	const char* gs_point_size_varyings[]	 = { "gs_tc_position", "gs_tc_value1",	"gs_tc_value2",
											 "gs_te_position", "gs_tc_pointSize", "gs_te_pointSize" };
	const char* non_gs_non_point_size_varyings[] = { "tc_position", "tc_value1", "tc_value2", "te_position",
													 "te_patch_data" };
	const char* non_gs_point_size_varyings[] = { "tc_position",  "tc_value1",	"tc_value2",	"te_position",
												 "tc_pointSize", "te_pointSize", "te_patch_data" };

	if (should_use_geometry_shader)
	{
		if (should_pass_point_size_data_in_gs)
		{
			n_varyings	= sizeof(gs_point_size_varyings) / sizeof(gs_point_size_varyings[0]);
			varyings	  = gs_point_size_varyings;
			varyings_size = varying_position_size +  /* gs_tc_position  */
							varying_value1_size +	/* gs_tc_value1    */
							varying_value2_size +	/* gs_tc_value2    */
							varying_position_size +  /* gs_te_position  */
							varying_pointSize_size + /* gs_tc_pointSize */
							varying_pointSize_size;  /* gs_te_pointSize */

			varying_tc_position_offset  = 0;
			varying_tc_value1_offset	= varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	= varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset  = varying_tc_value2_offset + varying_value2_size;
			varying_tc_pointSize_offset = varying_te_position_offset + varying_position_size;
			varying_te_pointSize_offset = varying_tc_pointSize_offset + varying_pointSize_size;
		}
		else
		{
			n_varyings	= sizeof(gs_non_point_size_varyings) / sizeof(gs_non_point_size_varyings[0]);
			varyings	  = gs_non_point_size_varyings;
			varyings_size = varying_position_size + /* gs_tc_position */
							varying_value1_size +   /* gs_tc_value1   */
							varying_value2_size +   /* gs_tc_value2   */
							varying_position_size;  /* gs_te_position */

			varying_tc_position_offset = 0;
			varying_tc_value1_offset   = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset   = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset = varying_tc_value2_offset + varying_value2_size;
		}
	} /* if (should_use_geometry_shader) */
	else
	{
		if (should_pass_point_size_data_in_ts)
		{
			n_varyings	= sizeof(non_gs_point_size_varyings) / sizeof(non_gs_point_size_varyings[0]);
			varyings	  = non_gs_point_size_varyings;
			varyings_size = varying_position_size +  /* tc_position   */
							varying_value1_size +	/* tc_value1     */
							varying_value2_size +	/* tc_value2     */
							varying_position_size +  /* te_position   */
							varying_pointSize_size + /* tc_pointSize  */
							varying_pointSize_size + /* te_pointSize  */
							varying_patch_data_size; /* tc_patch_data */

			varying_tc_position_offset   = 0;
			varying_tc_value1_offset	 = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	 = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset   = varying_tc_value2_offset + varying_value2_size;
			varying_tc_pointSize_offset  = varying_te_position_offset + varying_position_size;
			varying_te_pointSize_offset  = varying_tc_pointSize_offset + varying_pointSize_size;
			varying_te_patch_data_offset = varying_te_pointSize_offset + varying_pointSize_size;
		}
		else
		{
			n_varyings	= sizeof(non_gs_non_point_size_varyings) / sizeof(non_gs_non_point_size_varyings[0]);
			varyings	  = non_gs_non_point_size_varyings;
			varyings_size = varying_position_size +  /* tc_position   */
							varying_value1_size +	/* tc_value1     */
							varying_value2_size +	/* tc_value2     */
							varying_position_size +  /* te_position   */
							varying_patch_data_size; /* tc_patch_data */

			varying_tc_position_offset   = 0;
			varying_tc_value1_offset	 = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	 = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset   = varying_tc_value2_offset + varying_value2_size;
			varying_te_patch_data_offset = varying_te_position_offset + varying_position_size;
		}
	}

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	/* Compile all the shader objects */
	const glw::GLuint  shaders[] = { run.fs_id, run.gs_id, run.tcs_id, run.tes_id, run.vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			m_utils_ptr->compileShaders(1 /* n_shaders */, &shader, true);
		}
	}

	/* Link the program object */
	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

	/* Make sure the linking has succeeded */
	glw::GLint link_status = GL_FALSE;

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Now that we have a linked program object, it's time to determine how much space
	 * we will need to hold XFB data.
	 */
	unsigned int bo_size			  = 0;
	unsigned int n_result_tess_coords = 0;
	const float  tess_levels[]		  = /* as per shaders constructed by the test */
		{ 4.0f, 4.0f, 4.0f, 4.0f };

	n_result_tess_coords = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		run.primitive_mode, tess_levels, tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		true); /* is_point_mode_enabled */

	if (should_use_geometry_shader)
	{
		/* Geometry shader will output twice as many vertices */
		n_result_tess_coords *= 2;
	}

	run.n_result_vertices_per_patch = n_result_tess_coords;
	n_result_tess_coords *= m_n_input_vertices_per_run;
	bo_size = n_result_tess_coords * varyings_size;

	/* Proceed with buffer object storage allocation */
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, /* data */
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

	/* Great, time to actually render the data! */
	glw::GLenum tf_mode =
		TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, true); /* is_point_mode_enabled */

	gl.useProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

	gl.beginTransformFeedback(tf_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
	{
		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, m_n_input_vertices_per_run);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* The data should have landed in the buffer object storage by now. Map the BO into
	 * process space. */
	const void* bo_ptr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
										   bo_size, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Extract varyings' data */
	for (unsigned int n_tess_coord = 0; n_tess_coord < n_result_tess_coords; ++n_tess_coord)
	{
		const char* data = (const char*)bo_ptr + n_tess_coord * varyings_size;

		if (varying_tc_position_offset != -1)
		{
			const float* position_data((const float*)(data + varying_tc_position_offset));
			_vec4		 new_entry(position_data[0], position_data[1], position_data[2], position_data[3]);

			run.result_tc_position_data.push_back(new_entry);
		}

		if (varying_tc_value1_offset != -1)
		{
			const float* value1_data((const float*)(data + varying_tc_value1_offset));
			_vec4		 new_entry(value1_data[0], value1_data[1], value1_data[2], value1_data[3]);

			run.result_tc_value1_data.push_back(new_entry);
		}

		if (varying_tc_value2_offset != -1)
		{
			const int* value2_data((const int*)(data + varying_tc_value2_offset));
			_ivec4	 new_entry(value2_data[0], value2_data[1], value2_data[2], value2_data[3]);

			run.result_tc_value2_data.push_back(new_entry);
		}

		if (varying_te_position_offset != -1)
		{
			const float* position_data((const float*)(data + varying_te_position_offset));
			_vec4		 new_entry(position_data[0], position_data[1], position_data[2], position_data[3]);

			run.result_te_position_data.push_back(new_entry);
		}

		if (varying_tc_pointSize_offset != -1)
		{
			const float* pointSize_ptr((const float*)(data + varying_tc_pointSize_offset));

			run.result_tc_pointSize_data.push_back(*pointSize_ptr);
		}

		if (varying_te_pointSize_offset != -1)
		{
			const float* pointSize_ptr((const float*)(data + varying_te_pointSize_offset));

			run.result_te_pointSize_data.push_back(*pointSize_ptr);
		}

		if (varying_te_patch_data_offset != -1)
		{
			const float* patch_data_ptr((const float*)(data + varying_te_patch_data_offset));
			_vec4		 new_entry(patch_data_ptr[0], patch_data_ptr[1], patch_data_ptr[2], patch_data_ptr[3]);

			run.result_te_patch_data.push_back(new_entry);
		}
	} /* for (all XFB data associated with tessellated coordinates) */

	/* Now that we're done extracting the data we need, we're fine to unmap the buffer object */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
}